

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O2

double TasGrid::RuleLocal::scaleDiffX<(TasGrid::RuleLocal::erule)3>(int point)

{
  int iVar1;
  
  if (point != 0) {
    iVar1 = Maths::int2log2(point + 1);
    return (double)iVar1;
  }
  return 1.0;
}

Assistant:

double scaleDiffX(int point) {
        switch(effective_rule) {
            case erule::pwc:
                return 0.0;
            case erule::localp:
                return (point <= 2) ? 1.0 : static_cast<double>(Maths::int2log2(point - 1));
            case erule::semilocalp:
                return static_cast<double>(Maths::int2log2(point - 1));
            case erule::localp0:
                return (point == 0) ? 1.0 : static_cast<double>(Maths::int2log2(point + 1));
            default: // case erule::localpb:
                switch(point) {
                    case 0:
                    case 1: return 0.5;
                    case 2: return 1.0;
                    default:
                        return static_cast<double>(Maths::int2log2(point - 1));
                };
        };
    }